

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O0

_Bool borg_target_unknown_wall(wchar_t y,wchar_t x)

{
  _Bool _Var1;
  char *pcVar2;
  borg_kill *kill;
  monster_race *r_ptr;
  borg_grid *ag;
  _Bool x_hall;
  _Bool y_hall;
  wchar_t wStack_18;
  _Bool found;
  wchar_t n_y;
  wchar_t n_x;
  wchar_t x_local;
  wchar_t y_local;
  
  ag._3_1_ = 0;
  ag._2_1_ = 0;
  ag._1_1_ = 0;
  n_y = x;
  n_x = y;
  pcVar2 = format("# Perhaps wall near targetted location (%d,%d)",(ulong)(uint)y,(ulong)(uint)x);
  borg_note(pcVar2);
  wStack_18 = borg.c.x;
  ag._4_4_ = borg.c.y;
  if ((((borg_grids[borg.c.y + 1][borg.c.x].feat == '\x01') &&
       (borg_grids[borg.c.y + -1][borg.c.x].feat == '\x01')) &&
      ((borg_grids[borg.c.y + 2][borg.c.x].feat == '\x01' ||
       (borg_grids[borg.c.y + -2][borg.c.x].feat == '\x01')))) &&
     ((borg_grids[borg.c.y][borg.c.x + 1].feat != '\x01' &&
      (borg_grids[borg.c.y][borg.c.x + -1].feat != '\x01')))) {
    ag._1_1_ = 1;
  }
  if ((((borg_grids[borg.c.y][borg.c.x + 1].feat == '\x01') &&
       (borg_grids[borg.c.y][borg.c.x + -1].feat == '\x01')) &&
      ((borg_grids[borg.c.y][borg.c.x + 2].feat == '\x01' ||
       (borg_grids[borg.c.y][borg.c.x + -2].feat == '\x01')))) &&
     ((borg_grids[borg.c.y + 1][borg.c.x].feat != '\x01' &&
      (borg_grids[borg.c.y + -1][borg.c.x].feat != '\x01')))) {
    ag._2_1_ = 1;
  }
  while( true ) {
    _Var1 = flag_has_dbg(r_info[borg_kills[borg_grids[ag._4_4_][wStack_18].kill].r_idx].flags,0xb,
                         0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (_Var1) {
      pcVar2 = format("# Guessing wall (%d,%d) under ghostly target (%d,%d)",(ulong)(uint)ag._4_4_,
                      (ulong)(uint)wStack_18,(ulong)(uint)ag._4_4_,(ulong)(uint)wStack_18);
      borg_note(pcVar2);
      borg_grids[ag._4_4_][wStack_18].feat = '\x15';
      return true;
    }
    if (((borg_grids[ag._4_4_][wStack_18].feat == '\0') &&
        ((ag._4_4_ != borg.c.y || ((ag._2_1_ & 1) == 0)))) &&
       ((wStack_18 != borg.c.x || ((ag._1_1_ & 1) == 0)))) break;
    if ((wStack_18 == n_y) && (ag._4_4_ == n_x)) {
      borg_inc_motion((int *)((long)&ag + 4),&stack0xffffffffffffffe8,n_x,n_y,borg.c.y,borg.c.x);
      pcVar2 = format("# Guessing wall (%d,%d) near target (%d,%d)",(ulong)(uint)ag._4_4_,
                      (ulong)(uint)wStack_18,(ulong)(uint)n_x,(ulong)(uint)n_y);
      borg_note(pcVar2);
      borg_grids[ag._4_4_][wStack_18].feat = '\x15';
      return true;
    }
    borg_inc_motion((int *)((long)&ag + 4),&stack0xffffffffffffffe8,borg.c.y,borg.c.x,n_x,n_y);
  }
  pcVar2 = format("# Guessing wall (%d,%d) near target (%d,%d)",(ulong)(uint)ag._4_4_,
                  (ulong)(uint)wStack_18,(ulong)(uint)n_x,(ulong)(uint)n_y);
  borg_note(pcVar2);
  borg_grids[ag._4_4_][wStack_18].feat = '\x15';
  return true;
}

Assistant:

bool borg_target_unknown_wall(int y, int x)
{
    int  n_x, n_y;
    bool found  = false;
    bool y_hall = false;
    bool x_hall = false;

    borg_grid           *ag;
    struct monster_race *r_ptr;
    borg_kill           *kill;

    borg_note(format("# Perhaps wall near targetted location (%d,%d)", y, x));

    /* Determine "path" */
    n_x = borg.c.x;
    n_y = borg.c.y;

    /* check for 'in a hall' x axis */
    /* This check is for this: */
    /*
     *      x        x
     *    ..@.  or  .@..
     *      x        x
     *
     * 'x' being 'not a floor' and '.' being a floor.
     *
     * We would like to know if in a hall so we can place
     * the suspect wall off the hallway path.
     * like this:######x  P
     * ........@....
     * ##################
     * The shot may miss and we want the borg to guess the
     * wall to be at the X instead of first unkown grid which
     * is 3 west and 1 south of the X.
     */

    if ((borg_grids[borg.c.y + 1][borg.c.x].feat == FEAT_FLOOR
            && borg_grids[borg.c.y - 1][borg.c.x].feat == FEAT_FLOOR
            && (borg_grids[borg.c.y + 2][borg.c.x].feat == FEAT_FLOOR
                || borg_grids[borg.c.y - 2][borg.c.x].feat == FEAT_FLOOR))
        && (borg_grids[borg.c.y][borg.c.x + 1].feat != FEAT_FLOOR
            && borg_grids[borg.c.y][borg.c.x - 1].feat != FEAT_FLOOR))
        x_hall = true;

    /* check for 'in a hall' y axis.
     * Again, we want to place the suspected wall off our
     * hallway.
     */
    if ((borg_grids[borg.c.y][borg.c.x + 1].feat == FEAT_FLOOR
            && borg_grids[borg.c.y][borg.c.x - 1].feat == FEAT_FLOOR
            && (borg_grids[borg.c.y][borg.c.x + 2].feat == FEAT_FLOOR
                || borg_grids[borg.c.y][borg.c.x - 2].feat == FEAT_FLOOR))
        && (borg_grids[borg.c.y + 1][borg.c.x].feat != FEAT_FLOOR
            && borg_grids[borg.c.y - 1][borg.c.x].feat != FEAT_FLOOR))
        y_hall = true;

    while (1) {
        ag    = &borg_grids[n_y][n_x];
        kill  = &borg_kills[ag->kill];
        r_ptr = &r_info[kill->r_idx];

        if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
            borg_note(
                format("# Guessing wall (%d,%d) under ghostly target (%d,%d)",
                    n_y, n_x, n_y, n_x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found); /* not sure... should we return here? */
        }

        if (borg_grids[n_y][n_x].feat == FEAT_NONE
            && ((n_y != borg.c.y) || !y_hall)
            && ((n_x != borg.c.x) || !x_hall)) {
            borg_note(format(
                "# Guessing wall (%d,%d) near target (%d,%d)", n_y, n_x, y, x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found); /* not sure... should we return here?
                             maybe should mark ALL unknowns in path... */
        }

        /* Pathway found the target. */
        if (n_x == x && n_y == y) {
            /* end of the pathway */
            borg_inc_motion(&n_y, &n_x, y, x, borg.c.y, borg.c.x);
            borg_note(format(
                "# Guessing wall (%d,%d) near target (%d,%d)", n_y, n_x, y, x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found);
        }

        /* Calculate the new location */
        borg_inc_motion(&n_y, &n_x, borg.c.y, borg.c.x, y, x);
    }
}